

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

sexp sexp_bignum_fxsub(sexp ctx,sexp a,sexp_uint_t b)

{
  sexp psVar1;
  sexp_uint_t sVar2;
  sexp *ppsVar3;
  
  sVar2 = sexp_bignum_hi(a);
  ppsVar3 = &(a->value).type.slots;
  if ((sVar2 == 1) && (*ppsVar3 <= b && (sexp)(b - (long)*ppsVar3) != (sexp)0x0)) {
    (a->value).type.slots = (sexp)(b - (long)*ppsVar3);
    (a->value).flonum_bits[0] = -(a->value).flonum_bits[0];
  }
  else {
    for (; (sexp)b != (sexp)0x0; b = (sexp_uint_t)(psVar1 < b)) {
      psVar1 = *ppsVar3;
      *ppsVar3 = (sexp)((long)*ppsVar3 - b);
      ppsVar3 = ppsVar3 + 1;
    }
  }
  return a;
}

Assistant:

sexp sexp_bignum_fxsub (sexp ctx, sexp a, sexp_uint_t b) {
  sexp_uint_t len=sexp_bignum_hi(a), *data=sexp_bignum_data(a), borrow, i=0, n;
  if ((len == 1) && (b > data[0])) {
    data[0] = b - data[0];
    sexp_bignum_sign(a) = -sexp_bignum_sign(a);
  } else {
    for (borrow=b; borrow; i++) {
      n = data[i];
      data[i] -= borrow;
      borrow = (n < borrow);
    }
  }
  return a;
}